

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_queue.cpp
# Opt level: O3

void mpmc_pointer_basics<int*,10ul>(void)

{
  code *pcVar1;
  ulong uVar2;
  char extraout_AL;
  bool bVar3;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  char extraout_AL_06;
  char extraout_AL_07;
  char extraout_AL_08;
  char extraout_AL_09;
  char extraout_AL_10;
  char extraout_AL_11;
  char extraout_AL_12;
  ulong *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double extraout_XMM0_Qa_12;
  double extraout_XMM0_Qa_13;
  double extraout_XMM0_Qa_14;
  double extraout_XMM0_Qa_15;
  double extraout_XMM0_Qa_16;
  double extraout_XMM0_Qa_17;
  double extraout_XMM0_Qa_18;
  double extraout_XMM0_Qa_19;
  double extraout_XMM0_Qa_20;
  double extraout_XMM0_Qa_21;
  double extraout_XMM0_Qa_22;
  double dVar10;
  double extraout_XMM0_Qa_23;
  double extraout_XMM0_Qa_24;
  double extraout_XMM0_Qa_25;
  double extraout_XMM0_Qa_26;
  ResultBuilder DOCTEST_RB;
  size_t N;
  MPMC<int_*,_10UL> mpmc;
  Result local_42c8;
  ResultBuilder local_42a8;
  int *local_4230 [2];
  Expression_lhs<const_unsigned_long> local_4220;
  void *local_4210;
  unsigned_long local_4208;
  unsigned_long uStack_4200;
  ulong local_41f8 [2047];
  ulong local_200;
  ulong local_180;
  
  puVar4 = local_41f8;
  uVar5 = 0;
  do {
    *puVar4 = uVar5;
    uVar5 = uVar5 + 1;
    puVar4 = puVar4 + 2;
  } while (uVar5 != 0x400);
  local_200 = 0;
  local_180 = 0;
  local_4208 = 0x400;
  local_4210 = operator_new(0x1004);
  memset(local_4210,0,0x1004);
  local_42a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_42a8.super_AssertData.m_at = DT_REQUIRE;
  local_42a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_42a8.super_AssertData.m_line = 0x253;
  local_42a8.super_AssertData.m_expr = "mpmc.capacity() == N";
  local_42a8.super_AssertData.m_failed = true;
  local_42a8.super_AssertData.m_threw = false;
  local_42a8.super_AssertData.m_threw_as = false;
  local_42a8.super_AssertData.m_exception_type = "";
  local_42a8.super_AssertData.m_exception_string = "";
  local_4220.lhs = 0x400;
  local_4220.m_at = DT_REQUIRE;
  doctest::detail::Expression_lhs<const_unsigned_long>::operator==<unsigned_long,_nullptr>
            (&local_42c8,&local_4220,&local_4208);
  doctest::String::operator=(&local_42a8.super_AssertData.m_decomp,&local_42c8.m_decomp);
  local_42a8.super_AssertData._40_2_ =
       CONCAT11(local_42a8.super_AssertData.m_threw,local_42c8.m_passed) ^ 1;
  dVar10 = extraout_XMM0_Qa;
  if ((local_42c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_42c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_42c8.m_decomp.field_0.data.ptr);
    dVar10 = extraout_XMM0_Qa_00;
  }
  doctest::detail::ResultBuilder::log(&local_42a8,dVar10);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  if ((local_42a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_42a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_42a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_42a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_42a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                       local_42a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_42a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_42a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_42a8.super_AssertData.m_at = DT_REQUIRE;
  local_42a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_42a8.super_AssertData.m_line = 0x255;
  local_42a8.super_AssertData.m_expr = "mpmc.empty() == true";
  local_42a8.super_AssertData.m_failed = true;
  local_42a8.super_AssertData.m_threw = false;
  local_42a8.super_AssertData.m_threw_as = false;
  local_42a8.super_AssertData.m_exception_type = "";
  local_42a8.super_AssertData.m_exception_string = "";
  local_4220.lhs = 0xc00000001 - (ulong)(local_180 < local_200);
  local_4230[0] = (int *)CONCAT71(local_4230[0]._1_7_,1);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_42c8,(Expression_lhs<bool_const> *)&local_4220,(bool *)local_4230);
  doctest::String::operator=(&local_42a8.super_AssertData.m_decomp,&local_42c8.m_decomp);
  local_42a8.super_AssertData._40_2_ =
       CONCAT11(local_42a8.super_AssertData.m_threw,local_42c8.m_passed) ^ 1;
  dVar10 = extraout_XMM0_Qa_01;
  if ((local_42c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_42c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_42c8.m_decomp.field_0.data.ptr);
    dVar10 = extraout_XMM0_Qa_02;
  }
  doctest::detail::ResultBuilder::log(&local_42a8,dVar10);
  if (extraout_AL_00 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  if ((local_42a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_42a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_42a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_42a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_42a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                       local_42a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_42a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_4220.lhs = 0;
  local_42a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_42a8.super_AssertData.m_at = DT_REQUIRE;
  local_42a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_42a8.super_AssertData.m_line = 0x256;
  local_42a8.super_AssertData.m_expr = "mpmc.try_dequeue() == nullptr";
  local_42a8.super_AssertData.m_failed = true;
  local_42a8.super_AssertData.m_threw = false;
  local_42a8.super_AssertData.m_threw_as = false;
  local_42a8.super_AssertData.m_exception_type = "";
  local_42a8.super_AssertData.m_exception_string = "";
  uVar5 = local_180;
  do {
    while( true ) {
      uVar6 = uVar5;
      uVar8 = (ulong)(((uint)uVar6 & 0x3ff) << 4);
      uVar9 = *(ulong *)((long)local_41f8 + uVar8);
      if (uVar9 != uVar6 + 1) break;
      LOCK();
      bVar3 = uVar6 == local_180;
      uVar5 = uVar6;
      if (!bVar3) {
        uVar5 = local_180;
        uVar9 = local_180;
      }
      local_180 = uVar9;
      UNLOCK();
      if (bVar3) {
        local_4220.lhs = *(unsigned_long *)((long)&uStack_4200 + uVar8);
        *(ulong *)((long)local_41f8 + uVar8) = uVar6 + 0x400;
        goto LAB_00158634;
      }
    }
    uVar5 = local_180;
  } while (uVar6 + 1 <= uVar9);
LAB_00158634:
  local_4220.m_at = DT_REQUIRE;
  local_4230[0] = (int *)0x0;
  doctest::detail::Expression_lhs<int*const>::operator==
            (&local_42c8,(Expression_lhs<int*const> *)&local_4220,local_4230);
  doctest::String::operator=(&local_42a8.super_AssertData.m_decomp,&local_42c8.m_decomp);
  local_42a8.super_AssertData._40_2_ =
       CONCAT11(local_42a8.super_AssertData.m_threw,local_42c8.m_passed) ^ 1;
  dVar10 = extraout_XMM0_Qa_03;
  if ((local_42c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_42c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_42c8.m_decomp.field_0.data.ptr);
    dVar10 = extraout_XMM0_Qa_04;
  }
  doctest::detail::ResultBuilder::log(&local_42a8,dVar10);
  if (extraout_AL_01 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  if ((local_42a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_42a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_42a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_42a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_42a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                       local_42a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_42a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  if (local_4208 == 0) {
    uVar5 = 0;
  }
  else {
    uVar9 = 0;
    do {
      local_42a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_42a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_42a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_42a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_42a8.super_AssertData.m_at = DT_REQUIRE;
      local_42a8.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
      ;
      local_42a8.super_AssertData.m_line = 0x259;
      local_42a8.super_AssertData.m_expr = "mpmc.try_enqueue(&data[i]) == true";
      local_42a8.super_AssertData.m_failed = true;
      local_42a8.super_AssertData.m_threw = false;
      local_42a8.super_AssertData.m_threw_as = false;
      local_42a8.super_AssertData.m_exception_type = "";
      local_42a8.super_AssertData.m_exception_string = "";
      uVar5 = local_200;
      do {
        while( true ) {
          uVar8 = uVar5;
          uVar7 = (ulong)(((uint)uVar8 & 0x3ff) << 4);
          uVar6 = *(ulong *)((long)local_41f8 + uVar7);
          if (uVar6 != uVar8) break;
          LOCK();
          bVar3 = uVar8 == local_200;
          uVar5 = uVar8;
          uVar2 = uVar8 + 1;
          if (!bVar3) {
            uVar5 = local_200;
            uVar2 = local_200;
          }
          local_200 = uVar2;
          UNLOCK();
          if (bVar3) {
            *(void **)((long)&uStack_4200 + uVar7) = (void *)((long)local_4210 + uVar9 * 4);
            *(ulong *)((long)local_41f8 + uVar7) = uVar8 + 1;
            goto LAB_001587ef;
          }
        }
        uVar5 = local_200;
      } while (uVar8 <= uVar6);
LAB_001587ef:
      local_4220.lhs = (ulong)(uVar6 == uVar8) | 0xc00000000;
      local_4230[0] = (int *)CONCAT71(local_4230[0]._1_7_,1);
      doctest::detail::Expression_lhs<bool_const>::operator==
                (&local_42c8,(Expression_lhs<bool_const> *)&local_4220,(bool *)local_4230);
      doctest::String::operator=(&local_42a8.super_AssertData.m_decomp,&local_42c8.m_decomp);
      local_42a8.super_AssertData._40_2_ =
           CONCAT11(local_42a8.super_AssertData.m_threw,local_42c8.m_passed) ^ 1;
      dVar10 = extraout_XMM0_Qa_05;
      if ((local_42c8.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_42c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_42c8.m_decomp.field_0.data.ptr);
        dVar10 = extraout_XMM0_Qa_06;
      }
      doctest::detail::ResultBuilder::log(&local_42a8,dVar10);
      if (extraout_AL_02 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      if ((local_42a8.super_AssertData.m_failed == true) &&
         (bVar3 = doctest::detail::checkIfShouldThrow(local_42a8.super_AssertData.m_at), bVar3)) {
        doctest::detail::throwException();
      }
      if ((local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                           local_42a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                                           local_42a8.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_42a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                           local_42a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0))
      {
        operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                                           local_42a8.super_AssertData.m_exception.field_0.buf[0]));
      }
      uVar9 = uVar9 + 1;
      uVar5 = local_4208;
    } while (uVar9 < local_4208);
  }
  local_42a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_42a8.super_AssertData.m_at = DT_REQUIRE;
  local_42a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_42a8.super_AssertData.m_line = 0x25c;
  local_42a8.super_AssertData.m_expr = "mpmc.try_enqueue(&data[N]) == false";
  local_42a8.super_AssertData.m_failed = true;
  local_42a8.super_AssertData.m_threw = false;
  local_42a8.super_AssertData.m_threw_as = false;
  local_42a8.super_AssertData.m_exception_type = "";
  local_42a8.super_AssertData.m_exception_string = "";
  uVar9 = local_200;
  do {
    while( true ) {
      uVar8 = uVar9;
      uVar7 = (ulong)(((uint)uVar8 & 0x3ff) << 4);
      uVar6 = *(ulong *)((long)local_41f8 + uVar7);
      if (uVar6 != uVar8) break;
      LOCK();
      bVar3 = uVar8 == local_200;
      uVar9 = uVar8;
      uVar2 = uVar8 + 1;
      if (!bVar3) {
        uVar9 = local_200;
        uVar2 = local_200;
      }
      local_200 = uVar2;
      UNLOCK();
      if (bVar3) {
        *(void **)((long)&uStack_4200 + uVar7) = (void *)((long)local_4210 + uVar5 * 4);
        *(ulong *)((long)local_41f8 + uVar7) = uVar8 + 1;
        goto LAB_001589d3;
      }
    }
    uVar9 = local_200;
  } while (uVar8 <= uVar6);
LAB_001589d3:
  local_4220.lhs = (ulong)(uVar6 == uVar8) | 0xc00000000;
  local_4230[0] = (int *)((ulong)local_4230[0] & 0xffffffffffffff00);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_42c8,(Expression_lhs<bool_const> *)&local_4220,(bool *)local_4230);
  doctest::String::operator=(&local_42a8.super_AssertData.m_decomp,&local_42c8.m_decomp);
  local_42a8.super_AssertData._40_2_ =
       CONCAT11(local_42a8.super_AssertData.m_threw,local_42c8.m_passed) ^ 1;
  dVar10 = extraout_XMM0_Qa_07;
  if ((local_42c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_42c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_42c8.m_decomp.field_0.data.ptr);
    dVar10 = extraout_XMM0_Qa_08;
  }
  doctest::detail::ResultBuilder::log(&local_42a8,dVar10);
  if (extraout_AL_03 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  if ((local_42a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_42a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_42a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_42a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_42a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                       local_42a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_42a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_42a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_42a8.super_AssertData.m_at = DT_REQUIRE;
  local_42a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_42a8.super_AssertData.m_line = 0x25d;
  local_42a8.super_AssertData.m_expr = "mpmc.empty() == false";
  local_42a8.super_AssertData.m_failed = true;
  local_42a8.super_AssertData.m_threw = false;
  local_42a8.super_AssertData.m_threw_as = false;
  local_42a8.super_AssertData.m_exception_type = "";
  local_42a8.super_AssertData.m_exception_string = "";
  local_4220.lhs = (ulong)(local_200 <= local_180) | 0xc00000000;
  local_4230[0] = (int *)((ulong)local_4230[0] & 0xffffffffffffff00);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_42c8,(Expression_lhs<bool_const> *)&local_4220,(bool *)local_4230);
  doctest::String::operator=(&local_42a8.super_AssertData.m_decomp,&local_42c8.m_decomp);
  local_42a8.super_AssertData._40_2_ =
       CONCAT11(local_42a8.super_AssertData.m_threw,local_42c8.m_passed) ^ 1;
  dVar10 = extraout_XMM0_Qa_09;
  if ((local_42c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_42c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_42c8.m_decomp.field_0.data.ptr);
    dVar10 = extraout_XMM0_Qa_10;
  }
  doctest::detail::ResultBuilder::log(&local_42a8,dVar10);
  if (extraout_AL_04 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  if ((local_42a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_42a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_42a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_42a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_42a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                       local_42a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_42a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  if (local_4208 != 0) {
    uVar5 = 0;
    do {
      local_42a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_42a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_42a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_42a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_42a8.super_AssertData.m_at = DT_REQUIRE;
      local_42a8.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
      ;
      local_42a8.super_AssertData.m_line = 0x260;
      local_42a8.super_AssertData.m_expr = "mpmc.try_dequeue() == &data[i]";
      local_42a8.super_AssertData.m_failed = true;
      local_42a8.super_AssertData.m_threw = false;
      local_42a8.super_AssertData.m_threw_as = false;
      local_42a8.super_AssertData.m_exception_type = "";
      local_42a8.super_AssertData.m_exception_string = "";
      uVar9 = local_180;
      do {
        while( true ) {
          uVar8 = uVar9;
          uVar7 = (ulong)(((uint)uVar8 & 0x3ff) << 4);
          uVar6 = *(ulong *)((long)local_41f8 + uVar7);
          if (uVar6 != uVar8 + 1) break;
          LOCK();
          bVar3 = uVar8 == local_180;
          uVar9 = uVar8;
          if (!bVar3) {
            uVar9 = local_180;
            uVar6 = local_180;
          }
          local_180 = uVar6;
          UNLOCK();
          if (bVar3) {
            local_4220.lhs = *(unsigned_long *)((long)&uStack_4200 + uVar7);
            *(ulong *)((long)local_41f8 + uVar7) = uVar8 + 0x400;
            goto LAB_00158ceb;
          }
        }
        uVar9 = local_180;
      } while (uVar8 + 1 <= uVar6);
      local_4220.lhs = 0;
LAB_00158ceb:
      local_4220.m_at = DT_REQUIRE;
      local_4230[0] = (int *)((long)local_4210 + uVar5 * 4);
      doctest::detail::Expression_lhs<int*const>::operator==
                (&local_42c8,(Expression_lhs<int*const> *)&local_4220,local_4230);
      doctest::String::operator=(&local_42a8.super_AssertData.m_decomp,&local_42c8.m_decomp);
      local_42a8.super_AssertData._40_2_ =
           CONCAT11(local_42a8.super_AssertData.m_threw,local_42c8.m_passed) ^ 1;
      dVar10 = extraout_XMM0_Qa_11;
      if ((local_42c8.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_42c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_42c8.m_decomp.field_0.data.ptr);
        dVar10 = extraout_XMM0_Qa_12;
      }
      doctest::detail::ResultBuilder::log(&local_42a8,dVar10);
      if (extraout_AL_05 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      if ((local_42a8.super_AssertData.m_failed == true) &&
         (bVar3 = doctest::detail::checkIfShouldThrow(local_42a8.super_AssertData.m_at), bVar3)) {
        doctest::detail::throwException();
      }
      if ((local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                           local_42a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                                           local_42a8.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_42a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                           local_42a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0))
      {
        operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                                           local_42a8.super_AssertData.m_exception.field_0.buf[0]));
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < local_4208);
  }
  local_42a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_42a8.super_AssertData.m_at = DT_REQUIRE;
  local_42a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_42a8.super_AssertData.m_line = 0x263;
  local_42a8.super_AssertData.m_expr = "mpmc.empty() == true";
  local_42a8.super_AssertData.m_failed = true;
  local_42a8.super_AssertData.m_threw = false;
  local_42a8.super_AssertData.m_threw_as = false;
  local_42a8.super_AssertData.m_exception_type = "";
  local_42a8.super_AssertData.m_exception_string = "";
  local_4220.lhs = (ulong)(local_200 <= local_180) | 0xc00000000;
  local_4230[0] = (int *)CONCAT71(local_4230[0]._1_7_,1);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_42c8,(Expression_lhs<bool_const> *)&local_4220,(bool *)local_4230);
  doctest::String::operator=(&local_42a8.super_AssertData.m_decomp,&local_42c8.m_decomp);
  local_42a8.super_AssertData._40_2_ =
       CONCAT11(local_42a8.super_AssertData.m_threw,local_42c8.m_passed) ^ 1;
  dVar10 = extraout_XMM0_Qa_13;
  if ((local_42c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_42c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_42c8.m_decomp.field_0.data.ptr);
    dVar10 = extraout_XMM0_Qa_14;
  }
  doctest::detail::ResultBuilder::log(&local_42a8,dVar10);
  if (extraout_AL_06 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  if ((local_42a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_42a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_42a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_42a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_42a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                       local_42a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_42a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_4220.lhs = 0;
  local_42a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_42a8.super_AssertData.m_at = DT_REQUIRE;
  local_42a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_42a8.super_AssertData.m_line = 0x264;
  local_42a8.super_AssertData.m_expr = "mpmc.try_dequeue() == nullptr";
  local_42a8.super_AssertData.m_failed = true;
  local_42a8.super_AssertData.m_threw = false;
  local_42a8.super_AssertData.m_threw_as = false;
  local_42a8.super_AssertData.m_exception_type = "";
  local_42a8.super_AssertData.m_exception_string = "";
  uVar5 = local_180;
  do {
    while( true ) {
      uVar6 = uVar5;
      uVar8 = (ulong)(((uint)uVar6 & 0x3ff) << 4);
      uVar9 = *(ulong *)((long)local_41f8 + uVar8);
      if (uVar9 != uVar6 + 1) break;
      LOCK();
      bVar3 = uVar6 == local_180;
      uVar5 = uVar6;
      if (!bVar3) {
        uVar5 = local_180;
        uVar9 = local_180;
      }
      local_180 = uVar9;
      UNLOCK();
      if (bVar3) {
        local_4220.lhs = *(unsigned_long *)((long)&uStack_4200 + uVar8);
        *(ulong *)((long)local_41f8 + uVar8) = uVar6 + 0x400;
        goto LAB_0015901e;
      }
    }
    uVar5 = local_180;
  } while (uVar6 + 1 <= uVar9);
LAB_0015901e:
  local_4220.m_at = DT_REQUIRE;
  local_4230[0] = (int *)0x0;
  doctest::detail::Expression_lhs<int*const>::operator==
            (&local_42c8,(Expression_lhs<int*const> *)&local_4220,local_4230);
  doctest::String::operator=(&local_42a8.super_AssertData.m_decomp,&local_42c8.m_decomp);
  local_42a8.super_AssertData._40_2_ =
       CONCAT11(local_42a8.super_AssertData.m_threw,local_42c8.m_passed) ^ 1;
  dVar10 = extraout_XMM0_Qa_15;
  if ((local_42c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_42c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_42c8.m_decomp.field_0.data.ptr);
    dVar10 = extraout_XMM0_Qa_16;
  }
  doctest::detail::ResultBuilder::log(&local_42a8,dVar10);
  if (extraout_AL_07 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  if ((local_42a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_42a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_42a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_42a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_42a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                       local_42a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_42a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  if (local_4208 == 0) {
    uVar5 = 0;
  }
  else {
    uVar6 = 0;
    uVar9 = local_200;
    do {
      do {
        do {
          uVar5 = uVar9;
          uVar8 = (ulong)(((uint)uVar5 & 0x3ff) << 4);
          uVar9 = local_200;
        } while (*(ulong *)((long)local_41f8 + uVar8) != uVar5);
        uVar7 = uVar5 + 1;
        LOCK();
        bVar3 = uVar5 != local_200;
        uVar9 = uVar7;
        if (bVar3) {
          uVar5 = local_200;
          uVar9 = local_200;
        }
        local_200 = uVar9;
        UNLOCK();
        uVar9 = uVar5;
      } while (bVar3);
      *(void **)((long)&uStack_4200 + uVar8) = (void *)((long)local_4210 + uVar6 * 4);
      *(ulong *)((long)local_41f8 + uVar8) = uVar7;
      uVar6 = uVar6 + 1;
      uVar5 = local_4208;
      uVar9 = local_200;
    } while (uVar6 < local_4208);
  }
  local_42a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_42a8.super_AssertData.m_at = DT_REQUIRE;
  local_42a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_42a8.super_AssertData.m_line = 0x269;
  local_42a8.super_AssertData.m_expr = "mpmc.try_enqueue(&data[N]) == false";
  local_42a8.super_AssertData.m_failed = true;
  local_42a8.super_AssertData.m_threw = false;
  local_42a8.super_AssertData.m_threw_as = false;
  local_42a8.super_AssertData.m_exception_type = "";
  local_42a8.super_AssertData.m_exception_string = "";
  uVar9 = local_200;
  do {
    while( true ) {
      uVar8 = uVar9;
      uVar7 = (ulong)(((uint)uVar8 & 0x3ff) << 4);
      uVar6 = *(ulong *)((long)local_41f8 + uVar7);
      if (uVar6 != uVar8) break;
      LOCK();
      bVar3 = uVar8 == local_200;
      uVar9 = uVar8;
      uVar2 = uVar8 + 1;
      if (!bVar3) {
        uVar9 = local_200;
        uVar2 = local_200;
      }
      local_200 = uVar2;
      UNLOCK();
      if (bVar3) {
        *(void **)((long)&uStack_4200 + uVar7) = (void *)((long)local_4210 + uVar5 * 4);
        *(ulong *)((long)local_41f8 + uVar7) = uVar8 + 1;
        goto LAB_00159204;
      }
    }
    uVar9 = local_200;
  } while (uVar8 <= uVar6);
LAB_00159204:
  local_4220.lhs = (ulong)(uVar6 == uVar8) | 0xc00000000;
  local_4230[0] = (int *)((ulong)local_4230[0] & 0xffffffffffffff00);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_42c8,(Expression_lhs<bool_const> *)&local_4220,(bool *)local_4230);
  doctest::String::operator=(&local_42a8.super_AssertData.m_decomp,&local_42c8.m_decomp);
  local_42a8.super_AssertData._40_2_ =
       CONCAT11(local_42a8.super_AssertData.m_threw,local_42c8.m_passed) ^ 1;
  dVar10 = extraout_XMM0_Qa_17;
  if ((local_42c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_42c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_42c8.m_decomp.field_0.data.ptr);
    dVar10 = extraout_XMM0_Qa_18;
  }
  doctest::detail::ResultBuilder::log(&local_42a8,dVar10);
  if (extraout_AL_08 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  if ((local_42a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_42a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_42a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_42a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_42a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                       local_42a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_42a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  if (local_4208 != 0) {
    uVar5 = 0;
    do {
      local_42a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_42a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_42a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_42a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_42a8.super_AssertData.m_at = DT_REQUIRE;
      local_42a8.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
      ;
      local_42a8.super_AssertData.m_line = 0x26c;
      local_42a8.super_AssertData.m_expr = "mpmc.empty() == false";
      local_42a8.super_AssertData.m_failed = true;
      local_42a8.super_AssertData.m_threw = false;
      local_42a8.super_AssertData.m_threw_as = false;
      local_42a8.super_AssertData.m_exception_type = "";
      local_42a8.super_AssertData.m_exception_string = "";
      local_4220.lhs = (ulong)(local_200 <= local_180) | 0xc00000000;
      local_4230[0] = (int *)((ulong)local_4230[0] & 0xffffffffffffff00);
      doctest::detail::Expression_lhs<bool_const>::operator==
                (&local_42c8,(Expression_lhs<bool_const> *)&local_4220,(bool *)local_4230);
      doctest::String::operator=(&local_42a8.super_AssertData.m_decomp,&local_42c8.m_decomp);
      local_42a8.super_AssertData._40_2_ =
           CONCAT11(local_42a8.super_AssertData.m_threw,local_42c8.m_passed) ^ 1;
      dVar10 = extraout_XMM0_Qa_19;
      if ((local_42c8.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_42c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_42c8.m_decomp.field_0.data.ptr);
        dVar10 = extraout_XMM0_Qa_20;
      }
      doctest::detail::ResultBuilder::log(&local_42a8,dVar10);
      if (extraout_AL_09 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      if ((local_42a8.super_AssertData.m_failed == true) &&
         (bVar3 = doctest::detail::checkIfShouldThrow(local_42a8.super_AssertData.m_at), bVar3)) {
        doctest::detail::throwException();
      }
      if ((local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                           local_42a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                                           local_42a8.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_42a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                           local_42a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0))
      {
        operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                                           local_42a8.super_AssertData.m_exception.field_0.buf[0]));
      }
      local_42a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_42a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_42a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_42a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_42a8.super_AssertData.m_at = DT_REQUIRE;
      local_42a8.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
      ;
      local_42a8.super_AssertData.m_line = 0x26d;
      local_42a8.super_AssertData.m_expr = "mpmc.try_dequeue() == &data[i]";
      local_42a8.super_AssertData.m_failed = true;
      local_42a8.super_AssertData.m_threw = false;
      local_42a8.super_AssertData.m_threw_as = false;
      local_42a8.super_AssertData.m_exception_type = "";
      local_42a8.super_AssertData.m_exception_string = "";
      uVar9 = local_180;
      do {
        while( true ) {
          uVar8 = uVar9;
          uVar7 = (ulong)(((uint)uVar8 & 0x3ff) << 4);
          uVar6 = *(ulong *)((long)local_41f8 + uVar7);
          if (uVar6 != uVar8 + 1) break;
          LOCK();
          bVar3 = uVar8 == local_180;
          uVar9 = uVar8;
          if (!bVar3) {
            uVar9 = local_180;
            uVar6 = local_180;
          }
          local_180 = uVar6;
          UNLOCK();
          if (bVar3) {
            local_4220.lhs = *(unsigned_long *)((long)&uStack_4200 + uVar7);
            *(ulong *)((long)local_41f8 + uVar7) = uVar8 + 0x400;
            goto LAB_00159515;
          }
        }
        uVar9 = local_180;
      } while (uVar8 + 1 <= uVar6);
      local_4220.lhs = 0;
LAB_00159515:
      local_4220.m_at = DT_REQUIRE;
      local_4230[0] = (int *)((long)local_4210 + uVar5 * 4);
      doctest::detail::Expression_lhs<int*const>::operator==
                (&local_42c8,(Expression_lhs<int*const> *)&local_4220,local_4230);
      doctest::String::operator=(&local_42a8.super_AssertData.m_decomp,&local_42c8.m_decomp);
      local_42a8.super_AssertData._40_2_ =
           CONCAT11(local_42a8.super_AssertData.m_threw,local_42c8.m_passed) ^ 1;
      dVar10 = extraout_XMM0_Qa_21;
      if ((local_42c8.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_42c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_42c8.m_decomp.field_0.data.ptr);
        dVar10 = extraout_XMM0_Qa_22;
      }
      doctest::detail::ResultBuilder::log(&local_42a8,dVar10);
      if (extraout_AL_10 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      if ((local_42a8.super_AssertData.m_failed == true) &&
         (bVar3 = doctest::detail::checkIfShouldThrow(local_42a8.super_AssertData.m_at), bVar3)) {
        doctest::detail::throwException();
      }
      if ((local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                           local_42a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                                           local_42a8.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_42a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                           local_42a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0))
      {
        operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                                           local_42a8.super_AssertData.m_exception.field_0.buf[0]));
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < local_4208);
  }
  local_42a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_42a8.super_AssertData.m_at = DT_REQUIRE;
  local_42a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_42a8.super_AssertData.m_line = 0x270;
  local_42a8.super_AssertData.m_expr = "mpmc.empty() == true";
  local_42a8.super_AssertData.m_failed = true;
  local_42a8.super_AssertData.m_threw = false;
  local_42a8.super_AssertData.m_threw_as = false;
  local_42a8.super_AssertData.m_exception_type = "";
  local_42a8.super_AssertData.m_exception_string = "";
  local_4220.lhs = (ulong)(local_200 <= local_180) | 0xc00000000;
  local_4230[0] = (int *)CONCAT71(local_4230[0]._1_7_,1);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_42c8,(Expression_lhs<bool_const> *)&local_4220,(bool *)local_4230);
  doctest::String::operator=(&local_42a8.super_AssertData.m_decomp,&local_42c8.m_decomp);
  local_42a8.super_AssertData._40_2_ =
       CONCAT11(local_42a8.super_AssertData.m_threw,local_42c8.m_passed) ^ 1;
  dVar10 = extraout_XMM0_Qa_23;
  if ((local_42c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_42c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_42c8.m_decomp.field_0.data.ptr);
    dVar10 = extraout_XMM0_Qa_24;
  }
  doctest::detail::ResultBuilder::log(&local_42a8,dVar10);
  if (extraout_AL_11 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  if ((local_42a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_42a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_42a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_42a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_42a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                       local_42a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_42a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_4220.lhs = 0;
  local_42a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_42a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_42a8.super_AssertData.m_at = DT_REQUIRE;
  local_42a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_42a8.super_AssertData.m_line = 0x271;
  local_42a8.super_AssertData.m_expr = "mpmc.try_dequeue() == nullptr";
  local_42a8.super_AssertData.m_failed = true;
  local_42a8.super_AssertData.m_threw = false;
  local_42a8.super_AssertData.m_threw_as = false;
  local_42a8.super_AssertData.m_exception_type = "";
  local_42a8.super_AssertData.m_exception_string = "";
  uVar5 = local_180;
  do {
    while( true ) {
      uVar6 = uVar5;
      uVar8 = (ulong)(((uint)uVar6 & 0x3ff) << 4);
      uVar9 = *(ulong *)((long)local_41f8 + uVar8);
      if (uVar9 == uVar6 + 1) break;
      uVar5 = local_180;
      if (uVar9 < uVar6 + 1) {
LAB_00159892:
        local_4220.m_at = DT_REQUIRE;
        local_4230[0] = (int *)0x0;
        doctest::detail::Expression_lhs<int*const>::operator==
                  (&local_42c8,(Expression_lhs<int*const> *)&local_4220,local_4230);
        doctest::String::operator=(&local_42a8.super_AssertData.m_decomp,&local_42c8.m_decomp);
        local_42a8.super_AssertData._40_2_ =
             CONCAT11(local_42a8.super_AssertData.m_threw,local_42c8.m_passed) ^ 1;
        dVar10 = extraout_XMM0_Qa_25;
        if ((local_42c8.m_decomp.field_0.buf[0x17] < '\0') &&
           (local_42c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(local_42c8.m_decomp.field_0.data.ptr);
          dVar10 = extraout_XMM0_Qa_26;
        }
        doctest::detail::ResultBuilder::log(&local_42a8,dVar10);
        if (extraout_AL_12 == '\0') {
          if ((local_42a8.super_AssertData.m_failed == true) &&
             (bVar3 = doctest::detail::checkIfShouldThrow(local_42a8.super_AssertData.m_at), bVar3))
          {
            doctest::detail::throwException();
          }
          if ((local_42a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
             ((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                               local_42a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0))
          {
            operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_decomp.field_0._1_7_,
                                               local_42a8.super_AssertData.m_decomp.field_0.buf[0]))
            ;
          }
          if ((local_42a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
             ((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_,
                               local_42a8.super_AssertData.m_exception.field_0.buf[0]) !=
              (void *)0x0)) {
            operator_delete__((void *)CONCAT71(local_42a8.super_AssertData.m_exception.field_0._1_7_
                                               ,local_42a8.super_AssertData.m_exception.field_0.buf
                                                [0]));
          }
          operator_delete(local_4210,0x1004);
          return;
        }
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    LOCK();
    bVar3 = uVar6 != local_180;
    uVar5 = uVar6;
    if (bVar3) {
      uVar5 = local_180;
      uVar9 = local_180;
    }
    local_180 = uVar9;
    UNLOCK();
  } while (bVar3);
  local_4220.lhs = *(unsigned_long *)((long)&uStack_4200 + uVar8);
  *(ulong *)((long)local_41f8 + uVar8) = uVar6 + 0x400;
  goto LAB_00159892;
}

Assistant:

void mpmc_pointer_basics() {

  tf::MPMC<T, LogSize> mpmc;
  size_t N = (1<<LogSize);
  std::vector<std::remove_pointer_t<T>> data(N+1);

  REQUIRE(mpmc.capacity() == N);

  REQUIRE(mpmc.empty() == true);
  REQUIRE(mpmc.try_dequeue() == nullptr);

  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.try_enqueue(&data[i]) == true);
  }

  REQUIRE(mpmc.try_enqueue(&data[N]) == false);
  REQUIRE(mpmc.empty() == false);

  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.try_dequeue() == &data[i]);
  }

  REQUIRE(mpmc.empty() == true); 
  REQUIRE(mpmc.try_dequeue() == nullptr);

  for(size_t i=0; i<N; i++) {
    mpmc.enqueue(&data[i]);
  }
  REQUIRE(mpmc.try_enqueue(&data[N]) == false);
  
  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.empty() == false);
    REQUIRE(mpmc.try_dequeue() == &data[i]);
  }

  REQUIRE(mpmc.empty() == true); 
  REQUIRE(mpmc.try_dequeue() == nullptr);
}